

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

ucs4_t * utf8_to_ucs4(char *utf8,size_t length)

{
  byte bVar1;
  ulong uVar2;
  int *__ptr;
  ucs4_t *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong local_48;
  
  uVar4 = -(ulong)(length == 0) | length;
  for (uVar2 = 0; (local_48 = uVar4, uVar4 != uVar2 && (local_48 = uVar2, utf8[uVar2] != '\0'));
      uVar2 = uVar2 + 1) {
  }
  __ptr = (int *)malloc(0x1000);
  lVar12 = 0x400;
  uVar2 = 0;
  piVar9 = __ptr;
  do {
    if (local_48 <= uVar2) {
      puVar3 = (ucs4_t *)realloc(__ptr,((long)piVar9 - (long)__ptr) + 4);
      *(undefined4 *)((long)puVar3 + ((long)piVar9 - (long)__ptr)) = 0;
      return puVar3;
    }
    bVar1 = utf8[uVar2];
    uVar10 = (uint)(char)bVar1;
    iVar7 = 0;
    if ((char)bVar1 < '\0') {
      if ((uVar10 & 0x20) == 0) {
        uVar4 = uVar2 + 1;
        if (local_48 <= uVar4) goto LAB_001044c8;
        uVar5 = (uVar10 & 3) << 6 | (byte)utf8[uVar4] & 0x3f;
        uVar6 = uVar10 >> 2 & 7;
        goto LAB_0010437f;
      }
      if ((bVar1 & 0x10) == 0) {
        uVar4 = uVar2 + 2;
        if (local_48 <= uVar4) goto LAB_001044c8;
        uVar5 = ((int)utf8[uVar2 + 1] & 3U) << 6 | (byte)utf8[uVar2 + 2] & 0x3f;
        uVar6 = (uVar10 & 0xf) << 4 | (uint)(int)utf8[uVar2 + 1] >> 2 & 0xf;
        goto LAB_0010437f;
      }
      if ((uVar10 & 8) == 0) {
        uVar4 = uVar2 + 3;
        if (local_48 <= uVar4) {
LAB_001044c8:
          free(__ptr);
          return (ucs4_t *)0xffffffffffffffff;
        }
        uVar5 = ((int)utf8[uVar2 + 2] & 3U) << 6 | (byte)utf8[uVar2 + 3] & 0x3f;
        uVar6 = ((int)utf8[uVar2 + 1] & 0xfU) << 4 | (uint)(int)utf8[uVar2 + 2] >> 2 & 0xf;
        uVar11 = ((uint)(int)utf8[uVar2 + 1] >> 4 & 3) + (uVar10 & 7) * 4;
      }
      else {
        if (((bVar1 & 4) != 0) || (uVar4 = uVar2 + 4, local_48 <= uVar4)) goto LAB_001044c8;
        uVar5 = ((int)utf8[uVar2 + 3] & 3U) << 6 | (byte)utf8[uVar2 + 4] & 0x3f;
        uVar6 = ((int)utf8[uVar2 + 2] & 0xfU) << 4 | (uint)(int)utf8[uVar2 + 3] >> 2 & 0xf;
        uVar11 = (uint)(byte)(utf8[uVar2 + 1] << 2) | (uint)(int)utf8[uVar2 + 2] >> 4 & 3;
        iVar7 = (uVar10 & 3) << 0x18;
      }
    }
    else {
      uVar6 = 0;
      uVar4 = uVar2;
      uVar5 = uVar10;
LAB_0010437f:
      uVar11 = 0;
    }
    if (lVar12 == 0) {
      lVar8 = (long)piVar9 - (long)__ptr;
      lVar12 = lVar8 >> 2;
      __ptr = (int *)realloc(__ptr,lVar8 * 2);
      piVar9 = (int *)(lVar8 + (long)__ptr);
    }
    *piVar9 = uVar6 * 0x100 + uVar11 * 0x10000 + iVar7 + uVar5;
    piVar9 = piVar9 + 1;
    lVar12 = lVar12 + -1;
    uVar2 = uVar4 + 1;
  } while( true );
}

Assistant:

ucs4_t * utf8_to_ucs4(const char * utf8, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && utf8[i] != '\0'; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	ucs4_t * ucs4 = (ucs4_t *) malloc(sizeof(ucs4_t) * freesize);
	ucs4_t * pucs4 = ucs4;

	for (i = 0; i < length; i ++)
	{
		ucs4_t byte[4] = {0};
		if (GET_BIT(utf8[i], 7) == 0)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			byte[0] = utf8[i] & BITMASK(7);
		}
		else if (GET_BIT(utf8[i], 5) == 0)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			if (i + 1 >= length)
				goto err;

			byte[0] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(2)) << 6);
			byte[1] = (utf8[i] >> 2) & BITMASK(3);

			i += 1;
		}
		else if (GET_BIT(utf8[i], 4) == 0)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			if (i + 2 >= length)
				goto err;

			byte[0] = (utf8[i + 2] & BITMASK(6)) +
					((utf8[i + 1] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 1] >> 2) & BITMASK(4))
					+ ((utf8[i] & BITMASK(4)) << 4);

			i += 2;
		}
		else if (GET_BIT(utf8[i], 3) == 0)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 3 >= length)
				goto err;

			byte[0] = (utf8[i + 3] & BITMASK(6)) +
					((utf8[i + 2] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 2] >> 2) & BITMASK(4)) +
					((utf8[i + 1] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 1] >> 4) & BITMASK(2)) +
					((utf8[i] & BITMASK(3)) << 2);

			i += 3;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 4 >= length)
				goto err;

			byte[0] = (utf8[i + 4] & BITMASK(6)) +
					((utf8[i + 3] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 3] >> 2) & BITMASK(4)) +
					((utf8[i + 2] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 2] >> 4) & BITMASK(2)) +
					((utf8[i + 1] & BITMASK(6)) << 2);
			byte[3] = utf8[i] & BITMASK(2);
			i += 4;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 5 >= length)
				goto err;

			byte[0] = (utf8[i + 5] & BITMASK(6)) +
					((utf8[i + 4] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 4] >> 2) & BITMASK(4)) +
					((utf8[i + 3] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 3] >> 4) & BITMASK(2)) +
					((utf8[i + 2] & BITMASK(6)) << 2);
			byte[3] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(1)) << 6);
			i += 5;
		}
		else
			goto err;

		if (freesize == 0)
		{
			freesize = pucs4 - ucs4;
			ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * (freesize + freesize));
			pucs4 = ucs4 + freesize;
		}

		*pucs4 = (byte[3] << 24) + (byte[2] << 16) + (byte[1] << 8) + byte[0];

		pucs4 ++;
		freesize --;
	}

	length = (pucs4 - ucs4 + 1);
	ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * length);
	ucs4[length - 1] = 0;
	return ucs4;

err:
	free(ucs4);
	return (ucs4_t *) -1;
}